

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void display_player(wchar_t mode)

{
  _Bool _Var1;
  panel *p_00;
  panel *p;
  wchar_t mode_local;
  
  _Var1 = have_valid_char_sheet_config();
  if (!_Var1) {
    configure_char_sheet();
  }
  clear_from(L'\0');
  if ((Term == angband_term[0]) || ((player->upkeep->playing & 1U) != 0)) {
    display_player_stat_info();
    if (mode == L'\0') {
      display_player_xtra_info();
    }
    else {
      p_00 = get_panel_topleft();
      display_panel(p_00,true,&panels[0].bounds);
      panel_free(p_00);
      display_player_sust_info(cached_config);
      display_player_flag_info();
    }
  }
  return;
}

Assistant:

void display_player(int mode)
{
	if (!have_valid_char_sheet_config()) {
		configure_char_sheet();
	}

	/* Erase screen */
	clear_from(0);

	/* When not playing, do not display in subwindows */
	if (Term != angband_term[0] && !player->upkeep->playing) return;

	/* Stat info */
	display_player_stat_info();

	if (mode) {
		struct panel *p = panels[0].panel();
		display_panel(p, panels[0].align_left, &panels[0].bounds);
		panel_free(p);

		/* Stat/Sustain flags */
		display_player_sust_info(cached_config);

		/* Other flags */
		display_player_flag_info();
	} else {
		/* Extra info */
		display_player_xtra_info();
	}
}